

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall tinyusdz::crate::CrateReader::ReadTokens(CrateReader *this)

{
  pointer pSVar1;
  StreamReader *this_00;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  void *pvVar5;
  void *pvVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  char *pcVar11;
  string *err;
  uchar *in_R9;
  ulong uVar12;
  token tok;
  uint64_t num_tokens;
  uint64_t compressedSize;
  uint64_t uncompressedSize;
  vector<char,_std::allocator<char>_> chars;
  vector<char,_std::allocator<char>_> compressed;
  ostringstream ss_e;
  allocator local_249;
  string local_248;
  ulong local_228;
  string *local_220;
  void *local_218;
  void *local_210;
  _Vector_base<char,_std::allocator<char>_> local_208;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *local_1f0;
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  string local_1c8 [11];
  string local_50;
  
  lVar8 = this->_tokens_index;
  if ((lVar8 < 0) ||
     (pSVar1 = (this->_toc).sections.
               super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (long)(this->_toc).sections.
           super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>.
           _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 5 <= lVar8)) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    poVar3 = ::std::operator<<((ostream *)local_1c8,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,"[Crate]");
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"ReadTokens");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x1549);
    ::std::operator<<(poVar3," ");
    pcVar11 = "Invalid index for `TOKENS` section.";
  }
  else {
    if ((this->_version[0] == '\0') && (this->_version[1] < 4)) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      poVar3 = ::std::operator<<((ostream *)local_1c8,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,"[Crate]");
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ReadTokens");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x154e);
      ::std::operator<<(poVar3," ");
      ::std::__cxx11::string::string
                ((string *)&local_50,"Version must be 0.4.0 or later, but got {}.{}.{}",
                 (allocator *)&local_208);
      fmt::format<unsigned_char,unsigned_char,unsigned_char>
                (&local_248,(fmt *)&local_50,(string *)this,this->_version + 1,this->_version + 2,
                 in_R9);
      poVar3 = ::std::operator<<((ostream *)local_1c8,(string *)&local_248);
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::string::_M_dispose();
LAB_00192ac2:
      ::std::__cxx11::string::_M_dispose();
      goto LAB_001928e0;
    }
    this_00 = this->_sr;
    if (this_00->length_ < (ulong)pSVar1[lVar8].start) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      poVar3 = ::std::operator<<((ostream *)local_1c8,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,"[Crate]");
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ReadTokens");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x1553);
      ::std::operator<<(poVar3," ");
      pcVar11 = "Failed to move to `TOKENS` section.";
    }
    else {
      this_00->idx_ = pSVar1[lVar8].start;
      if (pSVar1[lVar8].size < 4) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        poVar3 = ::std::operator<<((ostream *)local_1c8,"[error]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,"[Crate]");
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"ReadTokens");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x1558);
        ::std::operator<<(poVar3," ");
        ::std::__cxx11::string::string
                  ((string *)&local_50,"`TOKENS` section data size is zero or too small.",
                   (allocator *)&local_208);
        fmt::format(&local_248,&local_50);
        poVar3 = ::std::operator<<((ostream *)local_1c8,(string *)&local_248);
        ::std::operator<<(poVar3,"\n");
        ::std::__cxx11::string::_M_dispose();
        goto LAB_00192ac2;
      }
      bVar2 = StreamReader::read8(this_00,&local_228);
      if (bVar2) {
        if (local_228 == 0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
          poVar3 = ::std::operator<<((ostream *)local_1c8,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,"[Crate]");
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReadTokens");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x1567);
          ::std::operator<<(poVar3," ");
          pcVar11 = "Empty tokens.";
        }
        else if ((this->_config).maxNumTokens < local_228) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
          poVar3 = ::std::operator<<((ostream *)local_1c8,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,"[Crate]");
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReadTokens");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x156b);
          ::std::operator<<(poVar3," ");
          pcVar11 = "Too many Tokens.";
        }
        else {
          bVar2 = StreamReader::read8(this->_sr,(uint64_t *)&local_210);
          if (bVar2) {
            if (local_210 < (void *)(local_228 + 3)) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
              poVar3 = ::std::operator<<((ostream *)local_1c8,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,"[Crate]");
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ReadTokens");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x157d);
              ::std::operator<<(poVar3," ");
              pcVar11 = "`TOKENS` section corrupted.";
            }
            else if (local_210 < (void *)0x4) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
              poVar3 = ::std::operator<<((ostream *)local_1c8,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,"[Crate]");
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ReadTokens");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x1582);
              ::std::operator<<(poVar3," ");
              pcVar11 = "uncompressedSize too small or zero bytes.";
            }
            else {
              bVar2 = StreamReader::read8(this->_sr,(uint64_t *)&local_218);
              if (bVar2) {
                if (local_218 < (void *)0x4) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
                  poVar3 = ::std::operator<<((ostream *)local_1c8,"[error]");
                  poVar3 = ::std::operator<<(poVar3,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                            );
                  poVar3 = ::std::operator<<(poVar3,"[Crate]");
                  poVar3 = ::std::operator<<(poVar3,":");
                  poVar3 = ::std::operator<<(poVar3,"ReadTokens");
                  poVar3 = ::std::operator<<(poVar3,"():");
                  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x158d);
                  ::std::operator<<(poVar3," ");
                  pcVar11 = "compressedSize is too small or zero bytes.";
                }
                else if ((void *)this->_sr->length_ < local_218) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
                  poVar3 = ::std::operator<<((ostream *)local_1c8,"[error]");
                  poVar3 = ::std::operator<<(poVar3,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                            );
                  poVar3 = ::std::operator<<(poVar3,"[Crate]");
                  poVar3 = ::std::operator<<(poVar3,":");
                  poVar3 = ::std::operator<<(poVar3,"ReadTokens");
                  poVar3 = ::std::operator<<(poVar3,"():");
                  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x1591);
                  ::std::operator<<(poVar3," ");
                  pcVar11 = "Compressed data size exceeds input file size.";
                }
                else if ((void *)pSVar1[lVar8].size < local_218) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
                  poVar3 = ::std::operator<<((ostream *)local_1c8,"[error]");
                  poVar3 = ::std::operator<<(poVar3,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                            );
                  poVar3 = ::std::operator<<(poVar3,"[Crate]");
                  poVar3 = ::std::operator<<(poVar3,":");
                  poVar3 = ::std::operator<<(poVar3,"ReadTokens");
                  poVar3 = ::std::operator<<(poVar3,"():");
                  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x1595);
                  ::std::operator<<(poVar3," ");
                  pcVar11 = "Compressed data size exceeds `TOKENS` section size.";
                }
                else {
                  pvVar6 = local_218;
                  if (local_218 <= local_210) {
                    pvVar6 = local_210;
                  }
                  uVar4 = this->_memoryUsage + (long)pvVar6 + 0x80U;
                  this->_memoryUsage = uVar4;
                  uVar12 = (this->_config).maxMemoryBudget;
                  if (uVar12 < uVar4) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
                    poVar3 = ::std::operator<<((ostream *)local_1c8,"[error]");
                    poVar3 = ::std::operator<<(poVar3,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                              );
                    poVar3 = ::std::operator<<(poVar3,"[Crate]");
                    poVar3 = ::std::operator<<(poVar3,":");
                    poVar3 = ::std::operator<<(poVar3,"ReadTokens");
                    poVar3 = ::std::operator<<(poVar3,"():");
                    iVar10 = 0x159d;
                  }
                  else {
                    this->_memoryUsage = uVar4 + (long)local_210;
                    if (uVar4 + (long)local_210 <= uVar12) {
                      std::vector<char,_std::allocator<char>_>::vector
                                ((vector<char,_std::allocator<char>_> *)&local_208,
                                 (size_type)local_210,(allocator_type *)local_1c8);
                      memset(local_208._M_impl.super__Vector_impl_data._M_start,0,
                             (long)local_208._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_208._M_impl.super__Vector_impl_data._M_start);
                      std::vector<char,_std::allocator<char>_>::vector
                                ((vector<char,_std::allocator<char>_> *)(local_1e8 + 8),
                                 (long)pvVar6 + 0x80U,(allocator_type *)local_1c8);
                      memset((void *)local_1e8._8_8_,0,
                             local_1d8._M_allocated_capacity - local_1e8._8_8_);
                      pvVar6 = local_218;
                      pvVar5 = (void *)StreamReader::read(this->_sr,(int)local_218,local_218,
                                                          local_1e8._8_8_);
                      if (pvVar6 == pvVar5) {
                        err = &this->_err;
                        local_220 = (string *)err;
                        pvVar6 = (void *)LZ4Compression::DecompressFromBuffer
                                                   ((char *)local_1e8._8_8_,
                                                    local_208._M_impl.super__Vector_impl_data.
                                                    _M_start,(size_t)local_218,(size_t)local_210,err
                                                   );
                        if (local_210 == pvVar6) {
                          lVar8 = (long)local_208._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_208._M_impl.super__Vector_impl_data._M_start;
                          local_1f0 = &this->_tokens;
                          uVar12 = 0;
                          do {
                            if (local_228 <= uVar12) break;
                            if (local_208._M_impl.super__Vector_impl_data._M_start == (char *)0x0) {
                              lVar9 = 0;
                            }
                            else {
                              for (lVar7 = 0;
                                  (lVar9 = lVar8, lVar8 != lVar7 &&
                                  (lVar9 = lVar7,
                                  local_208._M_impl.super__Vector_impl_data._M_start[lVar7] != '\0')
                                  ); lVar7 = lVar7 + 1) {
                              }
                            }
                            pcVar11 = local_208._M_impl.super__Vector_impl_data._M_start + lVar9 + 1
                            ;
                            if (local_208._M_impl.super__Vector_impl_data._M_finish < pcVar11) {
                              ::std::__cxx11::string::append((char *)local_220);
                              goto LAB_0019370a;
                            }
                            local_1c8[0]._M_dataplus._M_p = (pointer)&local_1c8[0].field_2;
                            local_1c8[0]._M_string_length = 0;
                            local_1c8[0].field_2._M_local_buf[0] = '\0';
                            local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
                            if (lVar9 == 0) {
                              local_248._M_string_length = 0;
                              local_248.field_2._M_local_buf[0] = '\0';
                            }
                            else {
                              ::std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_248,
                                         local_208._M_impl.super__Vector_impl_data._M_start,
                                         local_208._M_impl.super__Vector_impl_data._M_start + lVar9)
                              ;
                            }
                            ::std::__cxx11::string::operator=
                                      ((string *)local_1c8,(string *)&local_248);
                            ::std::__cxx11::string::_M_dispose();
                            Token::Token((Token *)&local_248,local_1c8);
                            ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
                            push_back(local_1f0,(value_type *)&local_248);
                            ::std::__cxx11::string::_M_dispose();
                            ::std::__cxx11::string::_M_dispose();
                            uVar12 = uVar12 + 1;
                            lVar8 = (long)local_208._M_impl.super__Vector_impl_data._M_finish -
                                    (long)pcVar11;
                            local_208._M_impl.super__Vector_impl_data._M_start = pcVar11;
                          } while (lVar8 != 0);
                          bVar2 = true;
                          if ((long)(this->_tokens).
                                    super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->_tokens).
                                    super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5 == local_228)
                          goto LAB_0019370c;
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
                          poVar3 = ::std::operator<<((ostream *)local_1c8,"[error]");
                          poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                          poVar3 = ::std::operator<<(poVar3,"[Crate]");
                          poVar3 = ::std::operator<<(poVar3,":");
                          poVar3 = ::std::operator<<(poVar3,"ReadTokens");
                          poVar3 = ::std::operator<<(poVar3,"():");
                          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x15f2);
                          ::std::operator<<(poVar3," ");
                          ::std::__cxx11::string::string
                                    ((string *)&local_50,
                                     "The number of tokens parsed {} does not match the requested one {}"
                                     ,&local_249);
                          local_1e8._0_8_ =
                               (long)(this->_tokens).
                                     super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->_tokens).
                                     super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5;
                          fmt::format<unsigned_long,unsigned_long>
                                    (&local_248,(fmt *)&local_50,(string *)local_1e8,&local_228,
                                     (unsigned_long *)err);
                          poVar3 = ::std::operator<<((ostream *)local_1c8,(string *)&local_248);
                          ::std::operator<<(poVar3,"\n");
                          ::std::__cxx11::string::_M_dispose();
                          ::std::__cxx11::string::_M_dispose();
                          ::std::__cxx11::stringbuf::str();
                          ::std::__cxx11::string::append(local_220);
                          ::std::__cxx11::string::_M_dispose();
                        }
                        else {
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
                          poVar3 = ::std::operator<<((ostream *)local_1c8,"[error]");
                          poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                          poVar3 = ::std::operator<<(poVar3,"[Crate]");
                          poVar3 = ::std::operator<<(poVar3,":");
                          poVar3 = ::std::operator<<(poVar3,"ReadTokens");
                          poVar3 = ::std::operator<<(poVar3,"():");
                          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x15b3);
                          ::std::operator<<(poVar3," ");
                          poVar3 = ::std::operator<<((ostream *)local_1c8,
                                                     "Failed to decompress data of Tokens.");
                          ::std::operator<<(poVar3,"\n");
                          ::std::__cxx11::stringbuf::str();
                          ::std::__cxx11::string::append(local_220);
                          ::std::__cxx11::string::_M_dispose();
                        }
                      }
                      else {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
                        poVar3 = ::std::operator<<((ostream *)local_1c8,"[error]");
                        poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                        poVar3 = ::std::operator<<(poVar3,"[Crate]");
                        poVar3 = ::std::operator<<(poVar3,":");
                        poVar3 = ::std::operator<<(poVar3,"ReadTokens");
                        poVar3 = ::std::operator<<(poVar3,"():");
                        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x15ab);
                        ::std::operator<<(poVar3," ");
                        poVar3 = ::std::operator<<((ostream *)local_1c8,
                                                                                                      
                                                  "Failed to read compressed data at `TOKENS` section."
                                                  );
                        ::std::operator<<(poVar3,"\n");
                        ::std::__cxx11::stringbuf::str();
                        ::std::__cxx11::string::append((string *)&this->_err);
                        ::std::__cxx11::string::_M_dispose();
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
LAB_0019370a:
                      bVar2 = false;
LAB_0019370c:
                      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                                ((_Vector_base<char,_std::allocator<char>_> *)(local_1e8 + 8));
                      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_208);
                      return bVar2;
                    }
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
                    poVar3 = ::std::operator<<((ostream *)local_1c8,"[error]");
                    poVar3 = ::std::operator<<(poVar3,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                              );
                    poVar3 = ::std::operator<<(poVar3,"[Crate]");
                    poVar3 = ::std::operator<<(poVar3,":");
                    poVar3 = ::std::operator<<(poVar3,"ReadTokens");
                    poVar3 = ::std::operator<<(poVar3,"():");
                    iVar10 = 0x159e;
                  }
                  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,iVar10);
                  ::std::operator<<(poVar3," ");
                  pcVar11 = "Reached to max memory budget.";
                }
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
                poVar3 = ::std::operator<<((ostream *)local_1c8,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,"[Crate]");
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ReadTokens");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x1587);
                ::std::operator<<(poVar3," ");
                pcVar11 = "Failed to read compressedSize at `TOKENS` section.";
              }
            }
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
            poVar3 = ::std::operator<<((ostream *)local_1c8,"[error]");
            poVar3 = ::std::operator<<(poVar3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar3 = ::std::operator<<(poVar3,"[Crate]");
            poVar3 = ::std::operator<<(poVar3,":");
            poVar3 = ::std::operator<<(poVar3,"ReadTokens");
            poVar3 = ::std::operator<<(poVar3,"():");
            poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x1573);
            ::std::operator<<(poVar3," ");
            pcVar11 = "Failed to read uncompressedSize at `TOKENS` section.";
          }
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        poVar3 = ::std::operator<<((ostream *)local_1c8,"[error]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,"[Crate]");
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"ReadTokens");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x1561);
        ::std::operator<<(poVar3," ");
        pcVar11 = "Failed to read # of tokens at `TOKENS` section.";
      }
    }
  }
  poVar3 = ::std::operator<<((ostream *)local_1c8,pcVar11);
  ::std::operator<<(poVar3,"\n");
LAB_001928e0:
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::append((string *)&this->_err);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  return false;
}

Assistant:

bool CrateReader::ReadTokens() {
  if ((_tokens_index < 0) || (_tokens_index >= int64_t(_toc.sections.size()))) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid index for `TOKENS` section.");
  }

  if ((_version[0] == 0) && (_version[1] < 4)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Version must be 0.4.0 or later, but got {}.{}.{}",
      _version[0], _version[1], _version[2]));
  }

  const crate::Section &sec = _toc.sections[size_t(_tokens_index)];
  if (!_sr->seek_set(uint64_t(sec.start))) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to move to `TOKENS` section.");
    return false;
  }

  if (sec.size < 4) {
     PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("`TOKENS` section data size is zero or too small."));
  }

  DCOUT("sec.start = " << sec.start);
  DCOUT("sec.size = " << sec.size);

  // # of tokens.
  uint64_t num_tokens;
  if (!_sr->read8(&num_tokens)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read # of tokens at `TOKENS` section.");
  }

  DCOUT("# of tokens = " << num_tokens);

  if (num_tokens == 0) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Empty tokens.");
  }

  if (num_tokens > _config.maxNumTokens) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many Tokens.");
  }

  // Tokens are lz4 compressed starting from version 0.4.0

  // Compressed token data.
  uint64_t uncompressedSize;
  if (!_sr->read8(&uncompressedSize)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read uncompressedSize at `TOKENS` section.");
  }

  DCOUT("uncompressedSize = " << uncompressedSize);


  // Must be larger than len(';-)') + all empty string case.
  // 3 = ';-)'
  // num_tokens = '\0' delimiter
  if ((3 + num_tokens) > uncompressedSize) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "`TOKENS` section corrupted.");
  }

  // At least min size should be 16 both for compress and uncompress.
  if (uncompressedSize < 4) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "uncompressedSize too small or zero bytes.");
  }

  uint64_t compressedSize;
  if (!_sr->read8(&compressedSize)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read compressedSize at `TOKENS` section.");
  }

  DCOUT("compressedSize = " << compressedSize);

  if (compressedSize < 4) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "compressedSize is too small or zero bytes.");
  }

  if (compressedSize > _sr->size()) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Compressed data size exceeds input file size.");
  }

  if (size_t(compressedSize) > size_t(sec.size)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Compressed data size exceeds `TOKENS` section size.");
  }

  // To combat with heap-buffer flow in lz4 cuased by corrupted lz4 compressed data,
  // We allocate same size of uncompressedSize(or larger one),
  // And further, extra 128 bytes for safety(LZ4_FAST_DEC_LOOP does 16 bytes stride memcpy)

  uint64_t bufSize = (std::max)(compressedSize, uncompressedSize);
  CHECK_MEMORY_USAGE(bufSize+128);
  CHECK_MEMORY_USAGE(uncompressedSize);


  // dst
  std::vector<char> chars(static_cast<size_t>(uncompressedSize));
  memset(chars.data(), 0, chars.size());

  std::vector<char> compressed(static_cast<size_t>(bufSize + 128));
  memset(compressed.data(), 0, compressed.size());

  if (compressedSize !=
      _sr->read(size_t(compressedSize), size_t(compressedSize),
                reinterpret_cast<uint8_t *>(compressed.data()))) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read compressed data at `TOKENS` section.");
    return false;
  }

  if (uncompressedSize !=
      LZ4Compression::DecompressFromBuffer(compressed.data(), chars.data(),
                                           size_t(compressedSize),
                                           size_t(uncompressedSize), &_err)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to decompress data of Tokens.");
  }

  // Split null terminated string into _tokens.
  const char *ps = chars.data();
  const char *pe = chars.data() + chars.size();
  const char *pcurr = ps;
  size_t nbytes_remain = size_t(chars.size());

  auto my_strnlen = [](const char *s, const size_t max_length) -> size_t {
    if (!s) return 0;

    size_t i = 0;
    for (; i < max_length; i++) {
      if (s[i] == '\0') {
        return i;
      }
    }

    // null character not found.
    return i;
  };

  // TODO(syoyo): Check if input string has exactly `n` tokens(`n` null
  // characters)
  for (size_t i = 0; i < num_tokens; i++) {
    DCOUT("n_remain = " << nbytes_remain);

    size_t len = my_strnlen(pcurr, nbytes_remain);
    DCOUT("len = " << len);

    if ((pcurr + (len+1)) > pe) {
      _err += "Invalid token string array.\n";
      return false;
    }

    std::string str;
    if (len > 0) {
      str = std::string(pcurr, len);
    } else {
      // Empty string allowed
      str = std::string();
    }

    pcurr += len + 1;  // +1 = '\0'
    nbytes_remain = size_t(pe - pcurr);
    if (pcurr > pe) {
      _err += "Invalid token string array.\n";
      return false;
    }

    value::token tok(str);

    DCOUT("token[" << i << "] = " << tok);
    _tokens.push_back(tok);

    if (nbytes_remain == 0) {
      // reached to the string buffer end.
      break;
    }
  }

  if (_tokens.size() != num_tokens) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("The number of tokens parsed {} does not match the requested one {}", _tokens.size(), num_tokens));
  }

  return true;
}